

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool ReadMeshDoublePrecisionVertices(ON_BinaryArchive *file,ON_SimpleArray<ON_3dPoint> *dV)

{
  bool bVar1;
  uint uVar2;
  char *sFormat;
  int line_number;
  byte bVar3;
  uint dVcount;
  bool bFailedCRC;
  int major_version;
  size_t sz;
  int minor_version;
  ON__UINT32 local_3c;
  bool local_35;
  int local_34;
  size_t local_30;
  int local_24;
  
  if (-1 < dV->m_capacity) {
    dV->m_count = 0;
  }
  local_34 = 0;
  local_24 = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(file,0x40008000,&local_34,&local_24);
  if (!bVar1) {
    return false;
  }
  if (local_34 == 1) {
    local_3c = 0;
    bVar1 = ON_BinaryArchive::ReadInt(file,&local_3c);
    if (bVar1) {
      if (local_3c == 0) {
        bVar3 = 1;
        goto LAB_004fd647;
      }
      local_30 = 0;
      bVar1 = ON_BinaryArchive::ReadCompressedBufferSize(file,&local_30);
      if (bVar1) {
        if (local_30 == (ulong)local_3c * 0x18) {
          ON_SimpleArray<ON_3dPoint>::SetCapacity(dV,(ulong)local_3c);
          if (((int)local_3c < 0) || (dV->m_capacity < (int)local_3c)) {
            uVar2 = dV->m_count;
          }
          else {
            dV->m_count = local_3c;
            uVar2 = local_3c;
          }
          if ((dV->m_a != (ON_3dPoint *)0x0) && (local_3c == uVar2)) {
            local_35 = false;
            bVar1 = ON_BinaryArchive::ReadCompressedBuffer(file,local_30,dV->m_a,&local_35);
            bVar3 = 1;
            if (bVar1) goto LAB_004fd647;
            goto LAB_004fd635;
          }
          sFormat = "Unable to allocate double precision vertex point array.";
          line_number = 0x85f;
        }
        else {
          sFormat = "Compressed double precision vertex point buffer size is wrong.";
          line_number = 0x856;
        }
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                   ,line_number,"",sFormat);
      }
    }
  }
LAB_004fd635:
  if (-1 < dV->m_capacity) {
    dV->m_count = 0;
  }
  bVar3 = 0;
LAB_004fd647:
  bVar1 = ON_BinaryArchive::EndRead3dmChunk(file);
  return (bool)(bVar1 & bVar3);
}

Assistant:

static
bool ReadMeshDoublePrecisionVertices( 
  ON_BinaryArchive& file, 
  ON_SimpleArray<ON_3dPoint>& dV 
  )
{
  dV.SetCount(0);

  int major_version = 0;
  int minor_version = 0;
  if ( !file.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version) )
    return false;

  bool rc = false;
  for(;;)
  {
    if (1 != major_version)
      break;

    unsigned int dVcount = 0;
    if (!file.ReadInt(&dVcount))
      break;

    if (0 == dVcount)
    {
      rc = true;
      break;
    }

    size_t sz = 0;
    if (!file.ReadCompressedBufferSize( &sz ))
      break;

    if (sz != ((size_t)dVcount)*sizeof(ON_3dPoint))
    {
      ON_ERROR("Compressed double precision vertex point buffer size is wrong.");
      break;
    }

    dV.SetCapacity(dVcount);
    dV.SetCount(dVcount);
    ON_3dPoint* a = dV.Array();
    if (nullptr == a || dVcount != dV.UnsignedCount())
    {
      ON_ERROR("Unable to allocate double precision vertex point array.");
      break;
    }
    
    bool bFailedCRC = 0;
    if (!file.ReadCompressedBuffer( sz, a, &bFailedCRC))
      break;

    rc = true;
    break;
  }

  if (!rc)
    dV.SetCount(0);
  if ( !file.EndRead3dmChunk() )
    rc = false;

  return rc;
}